

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_stock.cpp
# Opt level: O0

void class_instance_in_array(void)

{
  Stock *local_220;
  Stock *local_1b8;
  Stock *top;
  int n;
  allocator local_181;
  string local_180;
  allocator local_159;
  string local_158;
  allocator local_121;
  string local_120;
  double *local_100;
  undefined1 local_f8 [8];
  Stock stocks [4];
  int SIZE;
  
  top._6_1_ = 1;
  local_100 = (double *)local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"Apple",&local_121);
  L10_2::Stock::Stock((Stock *)local_f8,&local_120,0x14,30.0);
  local_100 = &stocks[0].total_val;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"Microsoft",&local_159);
  L10_2::Stock::Stock((Stock *)&stocks[0].total_val,&local_158,0x1e,50.0);
  local_100 = &stocks[1].total_val;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"Google",&local_181);
  L10_2::Stock::Stock((Stock *)&stocks[1].total_val,&local_180,10,50.0);
  local_100 = &stocks[2].total_val;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&n,"Facebook",(allocator *)((long)&top + 7));
  L10_2::Stock::Stock((Stock *)&stocks[2].total_val,(string *)&n,0x1e,30.0);
  top._6_1_ = 0;
  std::__cxx11::string::~string((string *)&n);
  std::allocator<char>::~allocator((allocator<char> *)((long)&top + 7));
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::operator<<((ostream *)&std::cout,"Stocks current holding:\n");
  for (top._0_4_ = 0; (int)top < 4; top._0_4_ = (int)top + 1) {
    L10_2::Stock::show((Stock *)&stocks[(long)(int)top + -1].total_val);
  }
  local_1b8 = (Stock *)local_f8;
  for (top._0_4_ = 1; (int)top < 4; top._0_4_ = (int)top + 1) {
    local_1b8 = L10_2::Stock::compare(local_1b8,(Stock *)&stocks[(long)(int)top + -1].total_val);
  }
  std::operator<<((ostream *)&std::cout,"Top valuabe holding:\n");
  L10_2::Stock::show(local_1b8);
  local_220 = (Stock *)&stocks[3].total_val;
  do {
    local_220 = local_220 + -1;
    L10_2::Stock::~Stock(local_220);
  } while (local_220 != (Stock *)local_f8);
  return;
}

Assistant:

void class_instance_in_array() {
    using namespace L10_2;
    const int SIZE = 4;
    //  数组初始化
    Stock stocks[SIZE] = {
            Stock("Apple", 20, 30),
            Stock("Microsoft", 30, 50),
            Stock("Google", 10, 50),
            Stock("Facebook", 30, 30)
    };
    std::cout << "Stocks current holding:\n";
    int n;
    for (n = 0; n < SIZE; n++) {
        stocks[n].show();
    }

    //  top 地址指向数组里第一个元素
    const Stock * top = &stocks[0];
    for(n = 1; n < SIZE; n++) {
        // top 本来就是一个地址，地址访问其实例方法使用 ->
//        top->show();
        //  compare 返回了一个 stock 引用，对其再取地址
        top = &top->compare(stocks[n]);
    }
    std::cout << "Top valuabe holding:\n",
    top->show();
}